

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

tuple<baryonyx::problem,_baryonyx::problem> *
baryonyx::split(tuple<baryonyx::problem,_baryonyx::problem> *__return_storage_ptr__,context *ctx,
               problem *pb,int variable_index_to_affect)

{
  pointer pbVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_t sVar5;
  undefined8 extraout_RAX;
  tuple<double,_baryonyx::show_size_type> *mem;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  preprocessor<baryonyx::problem> pp;
  uint local_310 [2];
  double local_308;
  undefined1 local_300 [248];
  preprocessor<baryonyx::problem> local_208;
  problem local_128;
  
  auVar6 = in_ZMM0._0_16_;
  if ((-1 < variable_index_to_affect) &&
     (variable_index_to_affect <
      (int)((ulong)((long)(pb->vars).values.
                          super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pb->vars).values.
                         super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555)) {
    pbVar1 = (pb->vars).names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar5 = memory_consumed(pb);
    auVar6 = vcvtusi2sd_avx512f(auVar6,sVar5);
    local_310[0] = 0;
    dVar2 = auVar6._0_8_ * 0.0009765625;
    dVar3 = dVar2 * 0.0009765625;
    local_308 = dVar3 * 0.0009765625;
    if ((dVar3 * 0.0009765625 <= 0.5) && (local_310[0] = 1, local_308 = dVar3, dVar3 <= 0.5)) {
      bVar4 = 0.5 < dVar2;
      local_310[0] = bVar4 ^ 3;
      local_308 = (double)((ulong)bVar4 * (long)dVar2 + (ulong)!bVar4 * (long)auVar6._0_8_);
    }
    to_string_abi_cxx11_((string *)local_300,(baryonyx *)local_310,mem);
    info<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (ctx,"  - Preprocessor starts split of variable {} (size: {})\n",
               pbVar1 + (uint)variable_index_to_affect,(string *)local_300);
    if ((undefined1 *)local_300._0_8_ != local_300 + 0x10) {
      operator_delete((void *)local_300._0_8_,local_300._16_8_ + 1);
    }
    anon_unknown.dwarf_1048b1::preprocessor<baryonyx::problem>::preprocessor(&local_208,ctx,pb);
    anon_unknown.dwarf_1048b1::preprocessor<baryonyx::problem>::operator()
              ((problem *)local_300,&local_208,variable_index_to_affect,true);
    anon_unknown.dwarf_1048b1::preprocessor<baryonyx::problem>::operator()
              (&local_128,&local_208,variable_index_to_affect,false);
    std::_Head_base<1UL,_baryonyx::problem,_false>::_Head_base<baryonyx::problem>
              ((_Head_base<1UL,_baryonyx::problem,_false> *)__return_storage_ptr__,&local_128);
    std::_Head_base<0UL,_baryonyx::problem,_false>::_Head_base<baryonyx::problem>
              (&(__return_storage_ptr__->
                super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>).
                super__Head_base<0UL,_baryonyx::problem,_false>,(problem *)local_300);
    problem::~problem(&local_128);
    problem::~problem((problem *)local_300);
    anon_unknown.dwarf_1048b1::preprocessor<baryonyx::problem>::~preprocessor(&local_208);
    return __return_storage_ptr__;
  }
  split();
  problem::~problem((problem *)local_300);
  anon_unknown.dwarf_1048b1::preprocessor<baryonyx::problem>::~preprocessor(&local_208);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::tuple<problem, problem>
split(const context& ctx, const problem& pb, int variable_index_to_affect)
{
    bx_expects(variable_index_to_affect >= 0 &&
               variable_index_to_affect < length(pb.vars.values));

    info(ctx,
         "  - Preprocessor starts split of variable {} (size: {})\n",
         pb.vars.names[variable_index_to_affect],
         to_string(memory_consumed_size(memory_consumed(pb))));

    ::preprocessor<problem> pp(ctx, pb);

    return std::make_tuple(pp(variable_index_to_affect, true),
                           pp(variable_index_to_affect, false));
}